

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos,ImGuiDockNode *dock_node)

{
  ImDrawList *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImVec2 IVar4;
  ImGuiCol local_ac;
  ImVec2 local_84;
  ImVec2 local_7c;
  ImVec2 local_74;
  ImU32 local_6c;
  ImU32 local_68;
  ImU32 text_col;
  ImU32 bg_col;
  bool pressed;
  bool held;
  bool hovered;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiDockNode *dock_node_local;
  ImVec2 *pos_local;
  ImGuiID id_local;
  
  pIVar2 = GImGui;
  bb.Max = (ImVec2)GImGui->CurrentWindow;
  ImVec2::ImVec2(&local_58,GImGui->FontSize,GImGui->FontSize);
  local_50 = ::operator+(pos,&local_58);
  _bg_col = ::operator*(&(pIVar2->Style).FramePadding,2.0);
  local_48 = ::operator+(&local_50,(ImVec2 *)&bg_col);
  ImRect::ImRect((ImRect *)local_40,pos,&local_48);
  ItemAdd((ImRect *)local_40,id,(ImRect *)0x0,0);
  text_col._1_1_ =
       ButtonBehavior((ImRect *)local_40,id,(bool *)((long)&text_col + 3),
                      (bool *)((long)&text_col + 2),0);
  if (((text_col._2_1_ & 1) == 0) || ((text_col._3_1_ & 1) == 0)) {
    local_ac = 0x15;
    if ((text_col._3_1_ & 1) != 0) {
      local_ac = 0x16;
    }
  }
  else {
    local_ac = 0x17;
  }
  local_68 = GetColorU32(local_ac,1.0);
  local_6c = GetColorU32(0,1.0);
  if (((text_col._3_1_ & 1) != 0) || ((text_col._2_1_ & 1) != 0)) {
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
    local_7c = ImRect::GetCenter((ImRect *)local_40);
    ImVec2::ImVec2(&local_84,0.0,-0.5);
    local_74 = ::operator+(&local_7c,&local_84);
    ImDrawList::AddCircleFilled(pIVar1,&local_74,pIVar2->FontSize * 0.5 + 1.0,local_68,0xc);
  }
  if (dock_node == (ImGuiDockNode *)0x0) {
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
    IVar4 = ::operator+((ImVec2 *)local_40,&(pIVar2->Style).FramePadding);
    RenderArrow(pIVar1,IVar4,local_6c,((byte)~*(byte *)((long)bb.Max + 0xce) & 1) * 2 + 1,1.0);
  }
  else {
    pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
    IVar4 = ::operator+((ImVec2 *)local_40,&(pIVar2->Style).FramePadding);
    RenderArrowDockMenu(pIVar1,IVar4,pIVar2->FontSize,local_6c);
  }
  bVar3 = IsItemActive();
  if ((bVar3) && (bVar3 = IsMouseDragging(0,-1.0), bVar3)) {
    StartMouseMovingWindowOrNode((ImGuiWindow *)bb.Max,dock_node,true);
  }
  return (bool)(text_col._1_1_ & 1);
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos, ImGuiDockNode* dock_node)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    // Render
    //bool is_dock_menu = (window->DockNodeAsHost && !window->Collapsed);
    ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    if (hovered || held)
        window->DrawList->AddCircleFilled(bb.GetCenter() + ImVec2(0,-0.5f), g.FontSize * 0.5f + 1.0f, bg_col, 12);

    if (dock_node)
        RenderArrowDockMenu(window->DrawList, bb.Min + g.Style.FramePadding, g.FontSize, text_col);
    else
        RenderArrow(window->DrawList, bb.Min + g.Style.FramePadding, text_col, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging(0))
        StartMouseMovingWindowOrNode(window, dock_node, true);

    return pressed;
}